

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O1

void __thiscall CodeWriter::loadWord(CodeWriter *this,string *Ri,int K,string *Rj)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = Rj;
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->tab)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->loadOp)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->tab)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(Ri->_M_dataplus)._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->comma)._M_dataplus._M_p);
  __val = -K;
  if (0 < K) {
    __val = K;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00137333;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00137333;
      }
      if (uVar3 < 10000) goto LAB_00137333;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00137333:
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)(K >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)K >> 0x1f) + (long)local_78),__len,__val);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  std::operator+(&local_50,"(",local_58);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->newLine)._M_dataplus._M_p);
  return;
}

Assistant:

void CodeWriter::loadWord(const std::string &Ri, int K, const std::string &Rj) {
    moonOutput += tab;
    moonOutput += loadOp;
    moonOutput += tab;
    moonOutput += Ri;
    moonOutput += comma;
    moonOutput += std::to_string(K);
    moonOutput += "(" + Rj + ")";
    moonOutput += newLine;
}